

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_mp_arithmetic(_func_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_arith)

{
  mp_int *x;
  mp_int *x_00;
  size_t sVar1;
  mp_int *x_01;
  ulong uVar2;
  
  x = mp_new(0x100);
  x_00 = mp_new(0x200);
  sVar1 = (*looplimit)(0x10);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      sVar1 = mp_max_bits(x);
      mp_random_bits_into(x,sVar1);
      sVar1 = mp_max_bits(x_00);
      mp_random_bits_into(x_00,sVar1);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      x_01 = (*mp_arith)(x,x_00);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      mp_free(x_01);
      uVar2 = uVar2 + 1;
      sVar1 = (*looplimit)(0x10);
    } while (uVar2 < sVar1);
  }
  mp_free(x);
  mp_free(x_00);
  return;
}

Assistant:

static void test_mp_arithmetic(mp_int *(*mp_arith)(mp_int *x, mp_int *y))
{
    mp_int *a = mp_new(256), *b = mp_new(512);
    for (size_t i = 0; i < looplimit(16); i++) {
        mp_random_fill(a);
        mp_random_fill(b);
        log_start();
        mp_int *r = mp_arith(a, b);
        log_end();
        mp_free(r);
    }
    mp_free(a);
    mp_free(b);
}